

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_threads.cc
# Opt level: O1

void __thiscall AllReduceSync::~AllReduceSync(AllReduceSync *this)

{
  condition_variable *this_00;
  
  if (this->m_mutex != (mutex *)0x0) {
    operator_delete(this->m_mutex);
  }
  this_00 = this->m_cv;
  if (this_00 != (condition_variable *)0x0) {
    std::condition_variable::~condition_variable(this_00);
    operator_delete(this_00);
  }
  if (this->buffers != (void **)0x0) {
    operator_delete__(this->buffers);
    return;
  }
  return;
}

Assistant:

AllReduceSync::~AllReduceSync()
{
  delete m_mutex;
  delete m_cv;
  delete[] buffers;
}